

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall QTextDocumentPrivate::appendUndoItem(QTextDocumentPrivate *this,QTextUndoCommand *c)

{
  bool bVar1;
  parameter_type t;
  qsizetype qVar2;
  const_reference pQVar3;
  reference this_00;
  QTextUndoCommand *in_RSI;
  QList<QTextUndoCommand> *in_RDI;
  long in_FS_OFFSET;
  QTextUndoCommand *last;
  int lastIdx;
  QTextUndoCommand cc;
  undefined8 in_stack_ffffffffffffffb8;
  undefined1 available;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined8 in_stack_fffffffffffffff0;
  QTextDocumentPrivate *this_01;
  
  available = (undefined1)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  this_01 = *(QTextDocumentPrivate **)(in_FS_OFFSET + 0x28);
  if ((in_RDI[7].d.size & 1) != 0) {
    t = (parameter_type)(long)*(int *)((long)&in_RDI[7].d.size + 4);
    qVar2 = QList<QTextUndoCommand>::size((QList<QTextUndoCommand> *)&in_RDI[6].d.size);
    if ((long)t < qVar2) {
      clearUndoRedoStacks(this_01,(Stacks)((ulong)in_stack_fffffffffffffff0 >> 0x20),
                          SUB81((ulong)in_stack_fffffffffffffff0 >> 0x18,0));
    }
    if (((*(int *)((long)&in_RDI[8].d.ptr + 4) != 0) && (-1 < (int)in_RDI[8].d.size)) &&
       (bVar1 = q20::cmp_not_equal<unsigned_int,int>(0,0x7d268d), bVar1)) {
      QList<QTextUndoCommand>::append(in_RDI,t);
      *(int *)((long)&in_RDI[7].d.size + 4) = *(int *)((long)&in_RDI[7].d.size + 4) + 1;
      *(undefined4 *)&in_RDI[8].d.size = 0xffffffff;
    }
    bVar1 = QList<QTextUndoCommand>::isEmpty((QList<QTextUndoCommand> *)0x7d2767);
    if ((!bVar1) && (((ulong)in_RDI[8].d.ptr & 1) != 0)) {
      in_stack_ffffffffffffffc4 = *(int *)((long)&in_RDI[7].d.size + 4) + -1;
      pQVar3 = QList<QTextUndoCommand>::at(in_RDI,(qsizetype)t);
      if (((((pQVar3->field_0x2 & 1) != 0) &&
           (((in_RSI->field_0x2 & 1) != 0 && (((byte)pQVar3->field_0x2 >> 1 & 1) == 0)))) ||
          (((in_RSI->field_0x2 & 1) == 0 && ((pQVar3->field_0x2 & 1) == 0)))) ||
         ((((in_RSI->command == 0 && (pQVar3->command == in_RSI->command)) &&
           ((pQVar3->field_0x2 & 1) != 0)) && ((in_RSI->field_0x2 & 1) == 0)))) {
        this_00 = QList<QTextUndoCommand>::operator[](in_RDI,(qsizetype)t);
        bVar1 = QTextUndoCommand::tryMerge(this_00,in_RSI);
        if (bVar1) goto LAB_007d2911;
      }
      available = (undefined1)((ulong)pQVar3 >> 0x38);
    }
    if (*(int *)((long)&in_RDI[7].d.size + 4) < *(int *)((long)&in_RDI[8].d.d + 4)) {
      *(undefined4 *)((long)&in_RDI[8].d.d + 4) = 0xffffffff;
    }
    QList<QTextUndoCommand>::append(in_RDI,t);
    *(int *)((long)&in_RDI[7].d.size + 4) = *(int *)((long)&in_RDI[7].d.size + 4) + 1;
    emitUndoAvailable((QTextDocumentPrivate *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(bool)available)
    ;
    emitRedoAvailable((QTextDocumentPrivate *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(bool)available)
    ;
    if ((in_RSI->field_0x2 & 1) == 0) {
      document((QTextDocumentPrivate *)0x7d2909);
      QTextDocument::undoCommandAdded((QTextDocument *)0x7d2911);
    }
  }
LAB_007d2911:
  if (*(QTextDocumentPrivate **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::appendUndoItem(const QTextUndoCommand &c)
{
    PMDEBUG("appendUndoItem, command=%d enabled=%d", c.command, undoEnabled);
    if (!undoEnabled)
        return;
    if (undoState < undoStack.size())
        clearUndoRedoStacks(QTextDocument::RedoStack);

    if (editBlock != 0 && editBlockCursorPosition >= 0) { // we had a beginEditBlock() with a cursor position
        if (q20::cmp_not_equal(c.pos, editBlockCursorPosition)) { // and that cursor position is different from the command
            // generate a CursorMoved undo item
            QT_INIT_TEXTUNDOCOMMAND(cc, QTextUndoCommand::CursorMoved, true, QTextUndoCommand::MoveCursor,
                                    0, 0, editBlockCursorPosition, 0, 0);
            undoStack.append(cc);
            undoState++;
            editBlockCursorPosition = -1;
        }
    }


    if (!undoStack.isEmpty() && modified) {
        const int lastIdx = undoState - 1;
        const QTextUndoCommand &last = undoStack.at(lastIdx);

        if ( (last.block_part && c.block_part && !last.block_end) // part of the same block => can merge
            || (!c.block_part && !last.block_part) // two single undo items => can merge
            || (c.command == QTextUndoCommand::Inserted && last.command == c.command && (last.block_part && !c.block_part))) {
            // two sequential inserts that are not part of the same block => can merge
            if (undoStack[lastIdx].tryMerge(c))
                return;
        }
    }
    if (modifiedState > undoState)
        modifiedState = -1;
    undoStack.append(c);
    undoState++;
    emitUndoAvailable(true);
    emitRedoAvailable(false);

    if (!c.block_part)
        emit document()->undoCommandAdded();
}